

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::createPredList(Graph *this)

{
  int local_20;
  int local_1c;
  int local_18;
  int j;
  int i;
  int nv;
  Graph *this_local;
  
  j = this->num_of_vert;
  _i = this;
  clearPredList(this);
  for (local_18 = 0; local_18 < j; local_18 = local_18 + 1) {
    for (local_1c = 0; local_1c < j; local_1c = local_1c + 1) {
      if (0 < this->adj_matrix[local_18][local_1c]) {
        local_20 = local_18 + 1;
        std::vector<int,_std::allocator<int>_>::push_back(this->pred_list + local_1c,&local_20);
      }
    }
  }
  return;
}

Assistant:

void Graph::createPredList(){
   int nv = this->num_of_vert;
   this->clearPredList();
   for(int i = 0; i < nv; i++)
      for(int j = 0; j < nv; j++){
         if(this->adj_matrix[i][j] >= 1)
            // pushes index of current column + 1 (current vertex)
            this->pred_list[j].push_back(i + 1);
      }
   return void();
}